

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer puVar1;
  int iVar2;
  Pattern *pPVar3;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  pointer puVar4;
  bool bVar5;
  
  bVar5 = (testCase->properties & IsHidden) == None;
  puVar4 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (puVar4 != puVar1) {
    pPVar3 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->(puVar4);
    iVar2 = (*pPVar3->_vptr_Pattern[2])(pPVar3,testCase);
    puVar4 = puVar4 + 1;
    bVar5 = true;
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  puVar4 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar4 == puVar1) {
      return bVar5;
    }
    pPVar3 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->(puVar4);
    iVar2 = (*pPVar3->_vptr_Pattern[2])(pPVar3,testCase);
    puVar4 = puVar4 + 1;
  } while ((char)iVar2 == '\0');
  return false;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        bool should_use = !testCase.isHidden();
        for (auto const& pattern : m_required) {
            should_use = true;
            if (!pattern->matches(testCase)) {
                return false;
            }
        }
        for (auto const& pattern : m_forbidden) {
            if (pattern->matches(testCase)) {
                return false;
            }
        }
        return should_use;
    }